

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int ra_shrink_to_fit(roaring_array_t *ra)

{
  _Bool _Var1;
  int *in_RDI;
  int savings;
  int32_t in_stack_00000014;
  roaring_array_t *in_stack_00000018;
  int local_4;
  
  local_4 = (in_RDI[1] - *in_RDI) * 0xb;
  _Var1 = realloc_array(in_stack_00000018,in_stack_00000014);
  if (_Var1) {
    in_RDI[1] = *in_RDI;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ra_shrink_to_fit(roaring_array_t *ra) {
    int savings = (ra->allocation_size - ra->size) *
                  (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    if (!realloc_array(ra, ra->size)) {
        return 0;
    }
    ra->allocation_size = ra->size;
    return savings;
}